

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdManAddDsd_rec(char *pStr,char **p,int *pMatches,If_DsdMan_t *pMan,word *pTruth,
                       uchar *pPerm,int *pnSupp)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong *pLits_00;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  int pLits_1 [12];
  int pLits [12];
  ulong local_268 [6];
  ulong local_238 [65];
  
  iVar3 = *pnSupp;
  pbVar15 = (byte *)*p;
  bVar1 = *pbVar15;
  bVar4 = bVar1;
  if (bVar1 == 0x21) {
    *p = (char *)(pbVar15 + 1);
    pbVar14 = pbVar15 + 1;
    pbVar15 = pbVar15 + 1;
    bVar4 = *pbVar14;
  }
  if ((byte)(bVar4 + 0x9f) < 0x1a) {
    *pnSupp = iVar3 + 1;
    pPerm[iVar3] = (bVar4 * '\x02' | bVar1 == 0x21) + 0x3e;
    return 2;
  }
  uVar8 = bVar4 - 0x3c;
  if (((uVar8 < 0x40) && ((0x8000000080000001U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
     (bVar4 == 0x28)) {
    if (bVar4 < 0x5b) {
      iVar10 = 3;
      if (bVar4 != 0x28) {
        if (bVar4 != 0x3c) {
LAB_0042bb4a:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x69b,
                        "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                       );
        }
        iVar10 = 5;
      }
    }
    else if (bVar4 == 0x7b) {
      iVar10 = 6;
    }
    else {
      if (bVar4 != 0x5b) goto LAB_0042bb4a;
      iVar10 = 4;
    }
    pbVar14 = (byte *)(pStr + pMatches[(long)pbVar15 - (long)pStr]);
    if ((uint)bVar4 + (uint)(bVar4 != 0x28) + 1 != (int)(char)*pbVar14) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x69c,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    pbVar15 = pbVar15 + 1;
    *p = (char *)pbVar15;
    lVar11 = 0;
    if (pbVar15 < pbVar14) {
      lVar11 = 0;
      do {
        iVar5 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
        *(int *)((long)local_238 + lVar11 * 4) = iVar5;
        lVar11 = lVar11 + 1;
        pbVar15 = (byte *)(*p + 1);
        *p = (char *)pbVar15;
      } while (pbVar15 < pbVar14);
    }
    if (pbVar15 != pbVar14) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x69f,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    pLits_00 = local_238;
    uVar8 = (uint)lVar11;
    goto LAB_0042b771;
  }
  if (5 < (byte)(bVar4 + 0xbf) && 9 < (byte)(bVar4 - 0x30)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6b3,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pbVar14 = pbVar15;
  if (bVar4 == 0x30) {
    pbVar14 = pbVar15 + (ulong)(pbVar15[1] == 0x78) * 2;
    bVar4 = *pbVar14;
  }
  if (((byte)(bVar4 - 0x3a) < 0xf6) && ((byte)((bVar4 & 0xdf) + 0xb9) < 0xfa)) {
    uVar7 = 0;
    uVar6 = 2;
LAB_0042b990:
    uVar7 = uVar7 * 0x1111;
    bVar16 = true;
LAB_0042b999:
    uVar12 = (ulong)((uint)uVar7 << 0x10 | (uint)uVar7 & 0xffff);
    if (!bVar16) {
      uVar12 = uVar7;
    }
    local_238[0] = (uVar12 & 0xffffffff) * 0x100000001;
    uVar8 = uVar6;
  }
  else {
    uVar7 = 0;
    do {
      do {
        uVar12 = uVar7;
        uVar7 = uVar12 + 1;
      } while (0xf5 < (byte)(pbVar14[uVar12 + 1] - 0x3a));
    } while (0xf9 < (byte)((pbVar14[uVar12 + 1] & 0xdf) + 0xb9));
    iVar10 = (int)uVar7;
    if (iVar10 == 0) {
      uVar7 = uVar7 & 0xffffffff;
      uVar6 = 2;
      goto LAB_0042b990;
    }
    if (iVar10 != 1) {
      uVar6 = 0x1f;
      if ((uint)uVar12 != 0) {
        for (; (uint)uVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
      uVar13 = 0x22 - uVar6;
      uVar9 = 1;
      if (uVar13 < 7) {
LAB_0042b83d:
        memset(local_238,0,(ulong)uVar9 << 3);
        uVar8 = uVar13;
      }
      else {
        uVar9 = 1 << (0x1cU - (char)uVar6 & 0x1f);
        uVar8 = 0x25;
        if (uVar6 != 0xfffffffd) goto LAB_0042b83d;
      }
      pbVar14 = pbVar14 + iVar10;
      bVar4 = 0;
      uVar12 = 0;
      uVar6 = 2;
      do {
        pbVar14 = pbVar14 + -1;
        bVar2 = *pbVar14;
        iVar10 = -0x30;
        if (((9 < (byte)(bVar2 - 0x30)) && (iVar10 = -0x37, 5 < (byte)(bVar2 + 0xbf))) &&
           (iVar10 = -0x57, 5 < (byte)(bVar2 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x4bf,"int Abc_TtReadHexDigit(char)");
        }
        local_238[uVar12 >> 4 & 0xfffffff] =
             local_238[uVar12 >> 4 & 0xfffffff] | (ulong)(iVar10 + (uint)bVar2) << (bVar4 & 0x3c);
        uVar12 = uVar12 + 1;
        bVar4 = bVar4 + 4;
      } while ((uVar7 & 0xffffffff) != uVar12);
      if (5 < (int)uVar8) goto LAB_0042b9bf;
      if ((int)uVar8 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      if (uVar8 < 2) {
        uVar7 = (ulong)((uint)local_238[0] & 3) * 5;
        uVar6 = uVar8;
        goto LAB_0042b990;
      }
      if (uVar8 == 2) {
        uVar7 = (ulong)((uint)local_238[0] & 0xf);
        goto LAB_0042b990;
      }
      uVar7 = (ulong)(uint)((int)(local_238[0] & 0xff) << 8) | local_238[0] & 0xff;
      uVar6 = 3;
      if (3 < uVar8) {
        uVar7 = local_238[0];
        uVar6 = uVar8;
      }
      bVar16 = uVar8 - 3 < 2;
      goto LAB_0042b999;
    }
    uVar13 = 2;
    uVar9 = 1;
    if (bVar4 < 0x41) {
      if (bVar4 != 0x30) {
        if (bVar4 != 0x35) goto LAB_0042b83d;
LAB_0042b940:
        local_238[0] = 0xaaaaaaaaaaaaaaaa;
        if (bVar4 == 0x35) {
          local_238[0] = 0x5555555555555555;
        }
        uVar8 = 1;
        goto LAB_0042b9bf;
      }
    }
    else {
      if (bVar4 == 0x41) goto LAB_0042b940;
      if (bVar4 != 0x46) goto LAB_0042b83d;
    }
    local_238[0] = -(ulong)(bVar4 != 0x30);
    uVar8 = 0;
  }
LAB_0042b9bf:
  iVar10 = 1 << ((char)uVar8 - 2U & 0x1f);
  if (uVar8 < 3) {
    iVar10 = 1;
  }
  pbVar14 = pbVar15 + iVar10;
  *p = (char *)pbVar14;
  if ((pbVar15[iVar10] != 0x7b) ||
     (pbVar15 = (byte *)(pStr + pMatches[(long)pbVar14 - (long)pStr]), *pbVar15 != 0x7d)) {
    __assert_fail("**p == \'{\' && *q == \'}\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6ab,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pbVar14 = pbVar14 + 1;
  *p = (char *)pbVar14;
  lVar11 = 0;
  if (pbVar14 < pbVar15) {
    lVar11 = 0;
    do {
      iVar10 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
      *(int *)((long)local_268 + lVar11 * 4) = iVar10;
      lVar11 = lVar11 + 1;
      pbVar14 = (byte *)(*p + 1);
      *p = (char *)pbVar14;
    } while (pbVar14 < pbVar15);
  }
  if ((uint)lVar11 != uVar8) {
    __assert_fail("i == nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6ae,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  if (pbVar14 != pbVar15) {
    __assert_fail("*p == q",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6af,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pLits_00 = local_268;
  pTruth = local_238;
  iVar10 = 6;
LAB_0042b771:
  uVar8 = If_DsdManOperation(pMan,iVar10,(int *)pLits_00,uVar8,pPerm + iVar3,pTruth);
  return bVar1 == 0x21 ^ uVar8;
}

Assistant:

int If_DsdManAddDsd_rec( char * pStr, char ** p, int * pMatches, If_DsdMan_t * pMan, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    unsigned char * pPermStart = pPerm + *pnSupp;
    int iRes = -1, fCompl = 0;
    if ( **p == '!' )
    {
        fCompl = 1;
        (*p)++;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        pPerm[(*pnSupp)++] = Abc_Var2Lit( **p - 'a', fCompl );
        return 2;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Type = 0, nLits = 0, pLits[DAU_MAX_VAR];
        char * q = pStr + pMatches[ *p - pStr ];
        if ( **p == '(' )
            Type = DAU_DSD_AND;
        else if ( **p == '[' )
            Type = DAU_DSD_XOR;
        else if ( **p == '<' )
            Type = DAU_DSD_MUX;
        else if ( **p == '{' )
            Type = DAU_DSD_PRIME;
        else assert( 0 );
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, Type, pLits, nLits, pPermStart, pTruth );
        return Abc_LitNotCond( iRes, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFunc[DAU_MAX_WORD];
        int nLits = 0, pLits[DAU_MAX_VAR];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( i == nVarsF );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, DAU_DSD_PRIME, pLits, nLits, pPermStart, pFunc );
        return Abc_LitNotCond( iRes, fCompl );
    }
    assert( 0 );
    return -1;
}